

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_mesh_ngon.cpp
# Opt level: O0

uint __thiscall ON_MeshNgon::BoundaryEdgeCount(ON_MeshNgon *this,ON_MeshFaceList *mesh_face_list)

{
  ON_2udex *base;
  ulong uVar1;
  uint uVar2;
  uint local_90;
  uint i1;
  uint i_1;
  uint boundary_edge_count;
  uint j;
  uint i;
  ON_2udex e;
  uint face_vi [4];
  uint local_5c;
  uint edge_count;
  ON_2udex *edges;
  undefined1 local_40 [8];
  ON_SimpleArray<ON_2udex> edge_buffer;
  uint edge_capacity;
  uint mesh_face_count;
  ON_MeshFaceList *mesh_face_list_local;
  ON_MeshNgon *this_local;
  
  if ((this->m_Fcount == 0) || (this->m_fi == (uint *)0x0)) {
    this_local._4_4_ = 0;
  }
  else {
    edge_buffer.m_capacity = ON_MeshFaceList::FaceCount(mesh_face_list);
    if (edge_buffer.m_capacity == 0) {
      this_local._4_4_ = 0;
    }
    else {
      edge_buffer.m_count = edge_buffer.m_capacity << 2;
      ON_SimpleArray<ON_2udex>::ON_SimpleArray
                ((ON_SimpleArray<ON_2udex> *)local_40,(ulong)(uint)edge_buffer.m_count);
      ON_SimpleArray<ON_2udex>::SetCount((ON_SimpleArray<ON_2udex> *)local_40,edge_buffer.m_count);
      base = ON_SimpleArray<ON_2udex>::Array((ON_SimpleArray<ON_2udex> *)local_40);
      local_5c = 0;
      for (boundary_edge_count = 0; boundary_edge_count < this->m_Fcount;
          boundary_edge_count = boundary_edge_count + 1) {
        ON_MeshFaceList::QuadFvi(mesh_face_list,this->m_fi[boundary_edge_count],&e.i);
        _j = (ON_2udex)((ulong)face_vi[1] << 0x20);
        for (i_1 = 0; i_1 < 4; i_1 = i_1 + 1) {
          j = i;
          i = face_vi[(ulong)i_1 - 2];
          if (j != i) {
            if (j < i) {
              base[local_5c] = _j;
            }
            else {
              base[local_5c].i = i;
              base[local_5c].j = j;
            }
            local_5c = local_5c + 1;
          }
        }
      }
      ON_qsort(base,(ulong)local_5c,8,Internal_compare_ngon_edges);
      i1 = 0;
      local_90 = 0;
      while (local_90 < local_5c) {
        uVar2 = local_90 + 1;
        uVar1 = (ulong)local_90;
        local_90 = uVar2;
        while (((local_90 < local_5c && (j = base[uVar1].i, base[local_90].i == j)) &&
               (i = base[uVar1].j, base[local_90].j == i))) {
          local_90 = local_90 + 1;
        }
        if (uVar2 == local_90) {
          i1 = i1 + 1;
        }
      }
      this_local._4_4_ = i1;
      ON_SimpleArray<ON_2udex>::~ON_SimpleArray((ON_SimpleArray<ON_2udex> *)local_40);
    }
  }
  return this_local._4_4_;
}

Assistant:

unsigned int ON_MeshNgon::BoundaryEdgeCount(const ON_MeshFaceList & mesh_face_list) const
{
  if (m_Fcount <= 0 || nullptr == m_fi)
    return 0;
  const unsigned int mesh_face_count = mesh_face_list.FaceCount();
  if (mesh_face_count <= 0)
    return 0;

  const unsigned int edge_capacity = 4 * mesh_face_count;
  ON_SimpleArray<ON_2udex> edge_buffer(edge_capacity);
  edge_buffer.SetCount(edge_capacity);
  ON_2udex* edges = edge_buffer.Array();
  unsigned int edge_count = 0;
  unsigned int face_vi[4];

  ON_2udex e;
  for (unsigned int i = 0; i < m_Fcount; i++)
  {
    mesh_face_list.QuadFvi(m_fi[i], face_vi);
    e.j = face_vi[3];
    for (unsigned int j = 0; j < 4; j++)
    {
      e.i = e.j;
      e.j = face_vi[j];
      if (e.i == e.j)
        continue;
      if (e.i < e.j)
      {
        edges[edge_count] = e;
      }
      else
      {
        edges[edge_count].i = e.j;
        edges[edge_count].j = e.i;
      }
      edge_count++;
    }
  }

  ON_qsort(edges, edge_count, sizeof(edges[0]), Internal_compare_ngon_edges);
  unsigned int boundary_edge_count = 0;

  for (unsigned int i = 0; i < edge_count; /*empty iterator*/)
  {
    e = edges[i++];
    const unsigned int i1 = i;
    for (/*empty init*/; i < edge_count; i++)
    {
      if (edges[i].i != e.i || edges[i].j != e.j)
        break;
    }
    if (i1 == i)
      boundary_edge_count++;
  }

  return boundary_edge_count;
}